

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QAdjustable.hpp
# Opt level: O2

void __thiscall
qclab::QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_>::QCircuit
          (QCircuit<std::complex<float>,_qclab::QObject<std::complex<float>_>_> *this,int nbQubits)

{
  (this->super_QAdjustable).fixed_ = false;
  (this->super_QObject<std::complex<float>_>)._vptr_QObject = (_func_int **)&PTR_nbQubits_001258e0;
  this->nbQubits_ = nbQubits;
  this->offset_ = 0;
  (this->gates_).
  super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gates_).
  super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gates_).
  super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < nbQubits) {
    return;
  }
  __assert_fail("nbQubits > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/QCircuit.hpp"
                ,0x34,
                "qclab::QCircuit<std::complex<float>>::QCircuit(const int) [T = std::complex<float>, G = qclab::QObject<std::complex<float>>]"
               );
}

Assistant:

QAdjustable( const bool fixed = false )
      : fixed_( fixed )
      { }